

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

int corpus_get_generic_featurevec(vector_t **mfc,int32 *n_frame,uint32 veclen)

{
  uint32 uVar1;
  uint32 uVar2;
  char *pcVar3;
  void *pvVar4;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar5;
  uint local_58;
  int local_54;
  uint32 no_retries;
  uint32 ret;
  uint32 j;
  uint32 i;
  uint32 n_c;
  uint32 n_f;
  float32 **cptr;
  float32 *coeff;
  vector_t *out;
  uint32 *puStack_20;
  uint32 veclen_local;
  int32 *n_frame_local;
  vector_t **mfc_local;
  
  local_58 = 0;
  if (requires_mfcc == 0) {
    mfc_local._4_4_ = -1;
  }
  else {
    out._4_4_ = veclen;
    puStack_20 = (uint32 *)n_frame;
    n_frame_local = (int32 *)mfc;
    if (mfc == (vector_t **)0x0) {
      cptr = (float32 **)0x0;
      _n_c = (float32 ***)0x0;
    }
    else {
      _n_c = &cptr;
    }
    do {
      if ((cur_ctl_sf == 0xffffffff) && (cur_ctl_ef == 0xffffffff)) {
        pcVar3 = mk_filename(1,cur_ctl_path);
        local_54 = areadfloat(pcVar3,(float **)_n_c,(int *)&j);
      }
      else {
        if ((cur_ctl_sf == 0xffffffff) || (cur_ctl_ef == 0xffffffff)) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                  ,0x52d,"Both start and end frame must be set in the ctl file\n");
          exit(1);
        }
        pcVar3 = mk_filename(1,cur_ctl_path);
        local_54 = areadfloat_part(pcVar3,cur_ctl_sf * out._4_4_,(cur_ctl_ef + 1) * out._4_4_ + -1,
                                   (float **)_n_c,(int *)&j);
      }
      if (local_54 == -1) {
        pcVar3 = mk_filename(1,cur_ctl_path);
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                       ,0x532,"Failed to read MFC file \'%s\'. Retrying after sleep...\n",pcVar3);
        local_58 = local_58 + 1;
        sleep(3);
        if (100 < local_58) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                  ,0x536,"Failed to get the files after 100 retries (about 300 seconds)\n");
          exit(1);
        }
      }
      uVar2 = cur_ctl_ef;
      uVar1 = cur_ctl_sf;
      uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    } while (local_54 == -1);
    if (((local_54 == 0) && (cur_ctl_sf != 0xffffffff)) && (cur_ctl_ef != 0xffffffff)) {
      pcVar3 = corpus_utt();
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
              ,0x53d,"Region [%d %d] for %s extends beyond end of file\n",(ulong)uVar1,(ulong)uVar2,
              pcVar3);
      uVar5 = (undefined4)((ulong)pcVar3 >> 0x20);
    }
    if (j % out._4_4_ != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
              ,0x541,"Expected mfcc vector len of %d, got %d (%d)\n",(ulong)out._4_4_,
              (ulong)j % (ulong)out._4_4_,CONCAT44(uVar5,j));
      exit(1);
    }
    i = j / out._4_4_;
    if (i == 0) {
      if (n_frame_local != (int32 *)0x0) {
        n_frame_local[0] = 0;
        n_frame_local[1] = 0;
      }
      if (puStack_20 != (uint32 *)0x0) {
        *puStack_20 = 0;
      }
    }
    if ((n_frame_local != (int32 *)0x0) && (cptr != (float32 **)0x0)) {
      pvVar4 = __ckd_calloc__((ulong)i,8,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                              ,0x54e);
      no_retries = 0;
      for (ret = 0; ret < i; ret = ret + 1) {
        *(ulong *)((long)pvVar4 + (ulong)ret * 8) = (long)cptr + (ulong)no_retries * 4;
        no_retries = out._4_4_ + no_retries;
      }
      *(void **)n_frame_local = pvVar4;
    }
    if (puStack_20 != (uint32 *)0x0) {
      *puStack_20 = i;
    }
    mfc_local._4_4_ = 0;
  }
  return mfc_local._4_4_;
}

Assistant:

int
corpus_get_generic_featurevec(vector_t **mfc,
			      int32 *n_frame,
			      uint32 veclen)
{
    vector_t *out;
    float32 *coeff, **cptr;
    uint32 n_f;
    uint32 n_c;
    uint32 i, j;
    uint32 ret=S3_ERROR;
    uint32 no_retries=0;

    if (!requires_mfcc) {
	/* asked for mfc data, but not set up to send it */
	return S3_ERROR;
    }

    if (mfc)
	cptr = &coeff;
    else {
	/* If mfc == NULL, just get the number of frames. */
	coeff = NULL;
	cptr = NULL;
    }

    do {
	if ((cur_ctl_sf == NO_FRAME) && (cur_ctl_ef == NO_FRAME)) {
	    ret = areadfloat(mk_filename(DATA_TYPE_MFCC, cur_ctl_path),
			     cptr, (int *)&n_c);
	}
	else if ((cur_ctl_sf != NO_FRAME) && (cur_ctl_ef != NO_FRAME)) {
	    ret = areadfloat_part(mk_filename(DATA_TYPE_MFCC, cur_ctl_path),
				  cur_ctl_sf * veclen,
				  (cur_ctl_ef + 1) * veclen - 1,
				  cptr, (int *)&n_c);
	}
	else {
	    E_FATAL("Both start and end frame must be set in the ctl file\n");
	}

	if (ret == S3_ERROR) {
	    E_ERROR_SYSTEM("Failed to read MFC file '%s'. Retrying after sleep...\n",
		    mk_filename(DATA_TYPE_MFCC, cur_ctl_path));
	    no_retries++;
	    sleep(3);
	    if(no_retries>100){ 
	      E_FATAL("Failed to get the files after 100 retries (about 300 seconds)\n");
	    }
	}
    } while (ret == S3_ERROR);

    if ((ret == 0) && (cur_ctl_sf != NO_FRAME) && (cur_ctl_ef != NO_FRAME)) {
	E_ERROR("Region [%d %d] for %s extends beyond end of file\n",
		cur_ctl_sf, cur_ctl_ef, corpus_utt());
    }

    if ((n_c % veclen) != 0) {
	E_FATAL("Expected mfcc vector len of %d, got %d (%d)\n", veclen, n_c % veclen, n_c);
    }
    
    n_f = n_c / veclen;

    if (n_f == 0) {
	if (mfc)
	    *mfc = NULL;
	if (n_frame)
	    *n_frame = 0;
    }

    if (mfc && coeff) {
	out = (vector_t *)ckd_calloc(n_f, sizeof(vector_t));

	for (i = 0, j = 0; i < n_f; i++, j += veclen) {
	    out[i] = &coeff[j];
	}

	*mfc = out;
    }
    if (n_frame)
	*n_frame = n_f;

    return S3_SUCCESS;
}